

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

void __thiscall
wasm::OptimizeInstructions::visitRefIsNull(OptimizeInstructions *this,RefIsNull *curr)

{
  Expression *pEVar1;
  ulong uVar2;
  Drop *this_00;
  Const *right;
  Block *rep;
  undefined8 in_RCX;
  ulong uVar3;
  optional<wasm::Type> type;
  Literal local_40;
  Builder local_28;
  Builder builder;
  
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)42>).super_Expression.type.id != 1) {
    local_28.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
         ).
         super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .currModule;
    pEVar1 = curr->value;
    uVar2 = (pEVar1->type).id;
    uVar3 = CONCAT71((int7)((ulong)in_RCX >> 8),uVar2 < 7);
    if ((uVar2 & 3) != 0 || uVar2 < 7) {
      skipCast(this,&curr->value,(Type)0x0);
    }
    else {
      this_00 = (Drop *)MixedArena::allocSpace(&(local_28.wasm)->allocator,0x18,8);
      (this_00->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
      (this_00->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
      this_00->value = pEVar1;
      Drop::finalize(this_00);
      Literal::makeZero(&local_40,(Type)0x2);
      right = Builder::makeConst(&local_28,&local_40);
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar3;
      rep = Builder::makeSequence(&local_28,(Expression *)this_00,(Expression *)right,type);
      replaceCurrent(this,(Expression *)rep);
      Literal::~Literal(&local_40);
    }
  }
  return;
}

Assistant:

void visitRefIsNull(RefIsNull* curr) {
    if (curr->type == Type::unreachable) {
      return;
    }

    // Optimizing RefIsNull is not that obvious, since even if we know the
    // result evaluates to 0 or 1 then the replacement may not actually save
    // code size, since RefIsNull is a single byte while adding a Const of 0
    // would be two bytes. Other factors are that we can remove the input and
    // the added drop on it if it has no side effects, and that replacing with a
    // constant may allow further optimizations later. For now, replace with a
    // constant, but this warrants more investigation. TODO

    Builder builder(*getModule());
    if (curr->value->type.isNonNullable()) {
      replaceCurrent(
        builder.makeSequence(builder.makeDrop(curr->value),
                             builder.makeConst(Literal::makeZero(Type::i32))));
    } else {
      skipCast(curr->value);
    }
  }